

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall gl3cts::TransformFeedback::LinkingErrors::testRepeatedVarying(LinkingErrors *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  GLint linking_status;
  string vertex_shader;
  allocator<char> local_295;
  int local_294;
  GLchar *local_290 [4];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,s_vertex_shader_template,(allocator<char> *)local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,(string *)local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",(allocator<char> *)&local_294
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"out float result;\n",&local_295);
  Utilities::preprocessCode((string *)local_1b0,&local_1d0,&local_1f0,&local_210);
  std::__cxx11::string::operator=((string *)local_290,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_230,(string *)local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"TEMPLATE_OUTPUT_SETTERS",(allocator<char> *)&local_294);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"    result = 0.577215664901532;\n",&local_295);
  Utilities::preprocessCode((string *)local_1b0,&local_230,&local_250,&local_270);
  std::__cxx11::string::operator=((string *)local_290,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  local_294 = 1;
  GVar4 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar3),this->m_context->m_testCtx->m_log,
                     (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,local_290[0],s_fragment_shader,
                     s_repeated_transform_feedback_varying,2,0x8c8c,false,(GLint *)&local_294);
  iVar2 = local_294;
  if (local_294 == 0 && GVar4 == 0) {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Linking failed as expected when Transform Feedback varying was specified twice."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Linking unexpectedly succeded when Transform Feedback varying was specified twice."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (GVar4 != 0) {
      (*((Functions *)CONCAT44(extraout_var,iVar3))->deleteProgram)(GVar4);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  return iVar2 == 0 && GVar4 == 0;
}

Assistant:

bool gl3cts::TransformFeedback::LinkingErrors::testRepeatedVarying(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Check if link process fails under the following conditions:
	 <varyings> specified by TransformFeedbackVaryings contains name of
	 variable more than once; */

	std::string vertex_shader(s_vertex_shader_template);

	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", "out float result;\n");
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS",
																		 "    result = 0.577215664901532;\n");

	glw::GLint linking_status = 1;

	glw::GLuint program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader,
		s_repeated_transform_feedback_varying, s_repeated_transform_feedback_varying_count, GL_INTERLEAVED_ATTRIBS,
		false, &linking_status);

	if ((GL_FALSE != linking_status) || program)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Linking unexpectedly succeded when Transform Feedback varying was specified twice."
			<< tcu::TestLog::EndMessage;

		if (program)
		{
			gl.deleteProgram(program);
		}

		return false;
	}

	/* Log success. */
	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message << "Linking failed as expected when Transform Feedback varying was specified twice."
		<< tcu::TestLog::EndMessage;

	return true;
}